

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O1

void __thiscall HighsOptions::HighsOptions(HighsOptions *this)

{
  HighsOptionsStruct::HighsOptionsStruct(&this->super_HighsOptionsStruct);
  (this->super_HighsOptionsStruct)._vptr_HighsOptionsStruct =
       (_func_int **)&PTR__HighsOptions_00448898;
  (this->records).super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->records).super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->records).super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initRecords(this);
  setLogOptions(this);
  return;
}

Assistant:

HighsOptions() {
    initRecords();
    setLogOptions();
  }